

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlock.c
# Opt level: O2

void closemutex(int sig)

{
  Uint32 UVar1;
  long lVar2;
  
  UVar1 = SDL_ThreadID();
  lVar2 = 0;
  if (UVar1 == mainthread) {
    UVar1 = 0;
  }
  printf("Process %u:  Cleaning up...\n",(ulong)UVar1);
  for (; lVar2 != 0x30; lVar2 = lVar2 + 8) {
    SDL_KillThread(*(undefined8 *)((long)threads + lVar2));
  }
  SDL_DestroyMutex(mutex);
  exit(sig);
}

Assistant:

void closemutex(int sig)
{
	Uint32 id = SDL_ThreadID();
	int i;
	printf("Process %u:  Cleaning up...\n", id == mainthread ? 0 : id);
	for ( i=0; i<6; ++i )
		SDL_KillThread(threads[i]);
	SDL_DestroyMutex(mutex);
	exit(sig);
}